

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diy_fp.h
# Opt level: O3

void __thiscall
floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>::normalize_from_ieee754
          (diy_fp<float,_floaxie::diy_fp_traits<float>_> *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = this->m_f;
  if (uVar2 != 0) {
    iVar3 = this->m_e;
    if ((uVar2 >> 0x18 & 1) == 0) {
      uVar1 = 0x1f;
      if ((uVar2 & 0xffffff) != 0) {
        for (; (uVar2 & 0xffffff) >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      uVar2 = uVar2 << (~(byte)uVar1 + 0x19 & 0x1f);
      iVar3 = (iVar3 - (uVar1 ^ 0x1f)) + 7;
    }
    this->m_f = uVar2 << 7;
    this->m_e = iVar3 + -7;
    return;
  }
  __assert_fail("m_f != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/floaxie/floaxie/diy_fp.h"
                ,0x1f2,
                "void floaxie::diy_fp<float>::normalize_from_ieee754() [FloatType = float, Traits = floaxie::diy_fp_traits<float>]"
               );
}

Assistant:

void normalize_from_ieee754() noexcept
		{
			constexpr auto mantissa_bit_width(std::numeric_limits<FloatType>::digits);

			static_assert(mantissa_bit_width >= 0, "Mantissa bit width should be positive.");

			assert(m_f != 0); // normalization of zero is undefined

			while (!nth_bit(m_f, mantissa_bit_width))
			{
				m_f <<= 1;
				m_e--;
			}

			constexpr mantissa_storage_type my_mantissa_size(bit_size<mantissa_storage_type>());
			constexpr mantissa_storage_type e_diff = my_mantissa_size - mantissa_bit_width - 1;

			m_f <<= e_diff;
			m_e -= e_diff;
		}